

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall
ChainstateManager::LoadExternalBlockFile
          (ChainstateManager *this,AutoFile *file_in,FlatFilePos *dbp,
          multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
          *blocks_with_unknown_parent)

{
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  bool *fNewBlock;
  CBlockIndex *pCVar4;
  reference ppCVar5;
  reference pvVar6;
  long in_RCX;
  long in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  ParamsWrapper<TransactionSerParams,_CBlock> PVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_FlatFilePos>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_FlatFilePos>_>_>
  pVar8;
  runtime_error *e;
  exception *e_1;
  Chainstate *c_1;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> *__range4_1;
  bool activation_failure;
  Chainstate *c;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> *__range4;
  bool genesis_activation_failure;
  CBlockIndex *pindex;
  uint64_t nBlockPos;
  exception *anon_var_0;
  uint64_t nRewind;
  CChainParams *params;
  shared_ptr<CBlock> pblockrecursive;
  iterator it;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_FlatFilePos>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_FlatFilePos>_>_>
  range;
  deque<uint256,_std::allocator<uint256>_> queue;
  iterator __end4_1;
  iterator __begin4_1;
  iterator __end4;
  iterator __begin4;
  shared_ptr<CBlock> pblock;
  uint nSize;
  BufferedFile blkdat;
  int nLoaded;
  time_point start;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock39;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock38;
  MessageStartChars buf;
  BlockValidationState dummy;
  uint256 head;
  BlockValidationState state_2;
  BlockValidationState state_1;
  BlockValidationState state;
  uint256 hash;
  CBlockHeader header;
  ChainstateManager *in_stack_fffffffffffff758;
  undefined4 uVar9;
  char *in_stack_fffffffffffff760;
  char *in_stack_fffffffffffff768;
  BufferedFile *in_stack_fffffffffffff770;
  iterator in_stack_fffffffffffff778;
  char *in_stack_fffffffffffff780;
  char *in_stack_fffffffffffff788;
  BufferedFile *in_stack_fffffffffffff790;
  undefined4 in_stack_fffffffffffff798;
  int in_stack_fffffffffffff79c;
  ChainstateManager *in_stack_fffffffffffff7a8;
  uint64_t in_stack_fffffffffffff7b0;
  undefined7 in_stack_fffffffffffff7b8;
  undefined1 in_stack_fffffffffffff7bf;
  BufferedFile *in_stack_fffffffffffff7c0;
  int in_stack_fffffffffffff7cc;
  element_type *in_stack_fffffffffffff7d8;
  ConstevalFormatString<2U> in_stack_fffffffffffff808;
  uint64_t *in_stack_fffffffffffff810;
  FlatFilePos *in_stack_fffffffffffff818;
  undefined5 in_stack_fffffffffffff820;
  undefined1 in_stack_fffffffffffff825;
  undefined1 in_stack_fffffffffffff826;
  byte in_stack_fffffffffffff827;
  BlockManager *in_stack_fffffffffffff828;
  undefined1 in_stack_fffffffffffff867;
  FlatFilePos *in_stack_fffffffffffff868;
  uint64_t *in_stack_fffffffffffff870;
  undefined7 in_stack_fffffffffffff878;
  byte in_stack_fffffffffffff87f;
  BlockValidationState *in_stack_fffffffffffff880;
  shared_ptr<const_CBlock> *in_stack_fffffffffffff888;
  ChainstateManager *in_stack_fffffffffffff890;
  Level level;
  MessageStartChars *in_stack_fffffffffffff900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff920;
  BlockValidationState *in_stack_fffffffffffff928;
  Chainstate *in_stack_fffffffffffff930;
  int local_62c;
  undefined1 local_578 [80];
  _Rb_tree_iterator<std::pair<const_uint256,_FlatFilePos>_> local_528;
  FlatFilePos local_4b0 [2];
  _Base_ptr local_4a0;
  _Base_ptr local_498;
  _Base_ptr local_468;
  Chainstate **local_460;
  FlatFilePos local_420 [2];
  ParamsWrapper<TransactionSerParams,_CBlock> local_410;
  shared_ptr<const_CBlock> local_400 [3];
  undefined1 local_3d0 [440];
  BufferedFile local_218;
  BufferedFile local_1d0 [2];
  BufferedFile local_120;
  undefined1 local_b8 [176];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDX == 0) != (in_RCX == 0)) {
    __assert_fail("!dbp == !blocks_with_unknown_parent",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x139f,
                  "void ChainstateManager::LoadExternalBlockFile(AutoFile &, FlatFilePos *, std::multimap<uint256, FlatFilePos> *)"
                 );
  }
  local_3d0._96_8_ = std::chrono::_V2::steady_clock::now();
  GetParams(in_stack_fffffffffffff758);
  local_3d0._92_4_ = 0;
  BufferedFile::BufferedFile
            (in_stack_fffffffffffff7c0,
             (AutoFile *)CONCAT17(in_stack_fffffffffffff7bf,in_stack_fffffffffffff7b8),
             in_stack_fffffffffffff7b0,(uint64_t)in_stack_fffffffffffff7a8);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         BufferedFile::GetPos((BufferedFile *)in_stack_fffffffffffff758);
  do {
    do {
      do {
        level = (Level)in_stack_fffffffffffff900;
        bVar1 = BufferedFile::eof((BufferedFile *)in_stack_fffffffffffff768);
        if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_014a9534;
        bVar1 = util::SignalInterrupt::operator_cast_to_bool
                          ((SignalInterrupt *)in_stack_fffffffffffff758);
        if (bVar1) {
          bVar1 = true;
          goto LAB_014a953f;
        }
        BufferedFile::SetPos(in_stack_fffffffffffff770,(uint64_t)in_stack_fffffffffffff768);
        std::numeric_limits<unsigned_long>::max();
        BufferedFile::SetLimit(in_stack_fffffffffffff770,(uint64_t)in_stack_fffffffffffff768);
        local_3d0._20_4_ = 0;
        in_stack_fffffffffffff900 =
             CChainParams::MessageStart((CChainParams *)in_stack_fffffffffffff758);
        std::array<unsigned_char,_4UL>::operator[]
                  ((array<unsigned_char,_4UL> *)in_stack_fffffffffffff768,
                   (size_type)in_stack_fffffffffffff760);
        BufferedFile::FindByte
                  (in_stack_fffffffffffff790,(byte)((ulong)in_stack_fffffffffffff7d8 >> 0x38));
        BufferedFile::GetPos((BufferedFile *)in_stack_fffffffffffff758);
        BufferedFile::operator>>
                  ((BufferedFile *)in_stack_fffffffffffff768,
                   (array<unsigned_char,_4UL> *)in_stack_fffffffffffff760);
        CChainParams::MessageStart((CChainParams *)in_stack_fffffffffffff758);
        bVar1 = std::operator==((array<unsigned_char,_4UL> *)in_stack_fffffffffffff778._M_node,
                                (array<unsigned_char,_4UL> *)in_stack_fffffffffffff770);
      } while (((bVar1 ^ 0xffU) & 1) != 0);
      BufferedFile::operator>>
                ((BufferedFile *)in_stack_fffffffffffff768,(uint *)in_stack_fffffffffffff760);
    } while (((uint)local_3d0._20_4_ < 0x50) || (4000000 < (uint)local_3d0._20_4_));
    fNewBlock = (bool *)BufferedFile::GetPos((BufferedFile *)in_stack_fffffffffffff758);
    if (in_RDX != 0) {
      *(int *)(in_RDX + 4) = (int)fNewBlock;
    }
    BufferedFile::SetLimit(in_stack_fffffffffffff770,(uint64_t)in_stack_fffffffffffff768);
    CBlockHeader::CBlockHeader((CBlockHeader *)in_stack_fffffffffffff758);
    BufferedFile::operator>>
              ((BufferedFile *)in_stack_fffffffffffff768,(CBlockHeader *)in_stack_fffffffffffff760);
    CBlockHeader::GetHash((CBlockHeader *)in_stack_fffffffffffff778._M_node);
    BufferedFile::SkipTo
              ((BufferedFile *)in_stack_fffffffffffff778._M_node,(uint64_t)in_stack_fffffffffffff770
              );
    std::shared_ptr<CBlock>::shared_ptr((shared_ptr<CBlock> *)in_stack_fffffffffffff758);
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff758);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
               (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff790,
               in_stack_fffffffffffff788,in_stack_fffffffffffff780,
               (int)((ulong)in_stack_fffffffffffff778._M_node >> 0x20),
               SUB81((ulong)in_stack_fffffffffffff778._M_node >> 0x18,0));
    CChainParams::GetConsensus((CChainParams *)in_stack_fffffffffffff758);
    bVar1 = ::operator!=((base_blob<256U> *)in_stack_fffffffffffff768,
                         (base_blob<256U> *)in_stack_fffffffffffff760);
    if (bVar1) {
      pCVar4 = ::node::BlockManager::LookupBlockIndex
                         ((BlockManager *)in_stack_fffffffffffff778._M_node,
                          (uint256 *)in_stack_fffffffffffff770);
      if (pCVar4 != (CBlockIndex *)0x0) goto LAB_014a841f;
      bVar1 = ::LogAcceptCategory((LogFlags)in_stack_fffffffffffff758,Trace);
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   in_stack_fffffffffffff778._M_node,(char *)in_stack_fffffffffffff770);
        uVar9 = (undefined4)((ulong)in_stack_fffffffffffff758 >> 0x20);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   in_stack_fffffffffffff778._M_node,(char *)in_stack_fffffffffffff770);
        base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff760);
        base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff760);
        in_stack_fffffffffffff778._M_node = (_Base_ptr)local_b8;
        in_stack_fffffffffffff770 = (BufferedFile *)(local_b8 + 0x20);
        in_stack_fffffffffffff768 = "LoadExternalBlockFile";
        in_stack_fffffffffffff760 = "%s: Out of order block %s, parent %s not known\n";
        in_stack_fffffffffffff758 = (ChainstateManager *)CONCAT44(uVar9,1);
        logging_function._M_len._5_1_ = in_stack_fffffffffffff825;
        logging_function._M_len._0_5_ = in_stack_fffffffffffff820;
        logging_function._M_len._6_1_ = in_stack_fffffffffffff826;
        logging_function._M_len._7_1_ = in_stack_fffffffffffff827;
        logging_function._M_str = (char *)in_stack_fffffffffffff828;
        source_file._M_str = (char *)in_stack_fffffffffffff818;
        source_file._M_len = (size_t)in_stack_fffffffffffff810;
        LogPrintFormatInternal<char[22],std::__cxx11::string,std::__cxx11::string>
                  (logging_function,source_file,in_stack_fffffffffffff7cc,
                   (LogFlags)in_stack_fffffffffffff7c0,(Level)in_stack_fffffffffffff900,
                   (ConstevalFormatString<3U>)in_stack_fffffffffffff808.fmt,(char (*) [22])args,
                   in_RDI,in_stack_fffffffffffff920);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff758);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff758);
      }
      if ((in_RDX != 0) && (in_RCX != 0)) {
        std::
        multimap<uint256,FlatFilePos,std::less<uint256>,std::allocator<std::pair<uint256_const,FlatFilePos>>>
        ::emplace<uint256&,FlatFilePos&>
                  ((multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
                    *)in_stack_fffffffffffff770,(uint256 *)in_stack_fffffffffffff768,
                   (FlatFilePos *)in_stack_fffffffffffff760);
      }
      local_62c = 2;
    }
    else {
LAB_014a841f:
      pCVar4 = ::node::BlockManager::LookupBlockIndex
                         ((BlockManager *)in_stack_fffffffffffff778._M_node,
                          (uint256 *)in_stack_fffffffffffff770);
      if ((pCVar4 == (CBlockIndex *)0x0) || ((pCVar4->nStatus & 8) == 0)) {
        BufferedFile::SetPos(in_stack_fffffffffffff770,(uint64_t)in_stack_fffffffffffff768);
        std::make_shared<CBlock>();
        in_stack_fffffffffffff890 = (ChainstateManager *)local_3d0;
        in_stack_fffffffffffff888 = local_400;
        std::shared_ptr<CBlock>::operator=
                  ((shared_ptr<CBlock> *)in_stack_fffffffffffff768,
                   (shared_ptr<CBlock> *)in_stack_fffffffffffff760);
        std::shared_ptr<CBlock>::~shared_ptr((shared_ptr<CBlock> *)in_stack_fffffffffffff758);
        std::__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                  ((__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   in_stack_fffffffffffff768);
        PVar7 = TransactionSerParams::operator()
                          ((TransactionSerParams *)in_stack_fffffffffffff768,
                           (CBlock *)in_stack_fffffffffffff760);
        local_410 = PVar7;
        BufferedFile::operator>>
                  ((BufferedFile *)in_stack_fffffffffffff768,
                   (ParamsWrapper<TransactionSerParams,_CBlock> *)in_stack_fffffffffffff760);
        uVar9 = (undefined4)((ulong)in_stack_fffffffffffff760 >> 0x20);
        in_stack_fffffffffffff880 =
             (BlockValidationState *)BufferedFile::GetPos((BufferedFile *)in_stack_fffffffffffff758)
        ;
        in_stack_fffffffffffff870 = &local_120.nRewind;
        BlockValidationState::BlockValidationState
                  ((BlockValidationState *)in_stack_fffffffffffff758);
        in_stack_fffffffffffff868 = local_420;
        std::shared_ptr<CBlock_const>::shared_ptr<CBlock,void>
                  ((shared_ptr<const_CBlock> *)in_stack_fffffffffffff758,
                   (shared_ptr<CBlock> *)0x14a858d);
        in_stack_fffffffffffff760 = (char *)CONCAT44(uVar9,1);
        in_stack_fffffffffffff758 = (ChainstateManager *)0x0;
        in_stack_fffffffffffff87f =
             AcceptBlock(in_stack_fffffffffffff890,in_stack_fffffffffffff888,
                         in_stack_fffffffffffff880,
                         (CBlockIndex **)
                         CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
                         SUB81((ulong)in_stack_fffffffffffff870 >> 0x38,0),in_stack_fffffffffffff868
                         ,fNewBlock,(bool)in_stack_fffffffffffff867);
        std::shared_ptr<const_CBlock>::~shared_ptr
                  ((shared_ptr<const_CBlock> *)in_stack_fffffffffffff758);
        if ((in_stack_fffffffffffff87f & 1) != 0) {
          local_3d0._92_4_ = local_3d0._92_4_ + 1;
        }
        in_stack_fffffffffffff867 =
             ValidationState<BlockValidationResult>::IsError
                       ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffff758);
        if ((bool)in_stack_fffffffffffff867) {
          local_62c = 3;
        }
        else {
          local_62c = 0;
        }
        BlockValidationState::~BlockValidationState
                  ((BlockValidationState *)in_stack_fffffffffffff758);
        if (local_62c != 0) goto LAB_014a883d;
      }
      else {
        CChainParams::GetConsensus((CChainParams *)in_stack_fffffffffffff758);
        bVar1 = ::operator!=((base_blob<256U> *)in_stack_fffffffffffff768,
                             (base_blob<256U> *)in_stack_fffffffffffff760);
        if ((bVar1) && (pCVar4->nHeight % 1000 == 0)) {
          bVar1 = ::LogAcceptCategory((LogFlags)in_stack_fffffffffffff758,Trace);
          if (bVar1) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       in_stack_fffffffffffff778._M_node,(char *)in_stack_fffffffffffff770);
            uVar9 = (undefined4)((ulong)in_stack_fffffffffffff758 >> 0x20);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       in_stack_fffffffffffff778._M_node,(char *)in_stack_fffffffffffff770);
            base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff760);
            in_stack_fffffffffffff770 = (BufferedFile *)&pCVar4->nHeight;
            in_stack_fffffffffffff768 = (char *)&local_120;
            in_stack_fffffffffffff760 = "Block Import: already had block %s at height %d\n";
            in_stack_fffffffffffff758 = (ChainstateManager *)CONCAT44(uVar9,1);
            logging_function_00._M_len._5_1_ = in_stack_fffffffffffff825;
            logging_function_00._M_len._0_5_ = in_stack_fffffffffffff820;
            logging_function_00._M_len._6_1_ = in_stack_fffffffffffff826;
            logging_function_00._M_len._7_1_ = in_stack_fffffffffffff827;
            logging_function_00._M_str = (char *)in_stack_fffffffffffff828;
            source_file_00._M_str = (char *)in_stack_fffffffffffff818;
            source_file_00._M_len = (size_t)in_stack_fffffffffffff810;
            LogPrintFormatInternal<std::__cxx11::string,int>
                      (logging_function_00,source_file_00,in_stack_fffffffffffff7cc,
                       (LogFlags)in_stack_fffffffffffff7c0,(Level)in_stack_fffffffffffff900,
                       in_stack_fffffffffffff808,args,(int *)in_RDI);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff758);
          }
        }
      }
      local_62c = 0;
    }
LAB_014a883d:
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff758);
    if (local_62c == 0) {
      CChainParams::GetConsensus((CChainParams *)in_stack_fffffffffffff758);
      bVar1 = ::operator==((base_blob<256U> *)in_stack_fffffffffffff768,
                           (base_blob<256U> *)in_stack_fffffffffffff760);
      if (bVar1) {
        bVar1 = false;
        GetAll(in_stack_fffffffffffff7a8);
        local_460 = (Chainstate **)
                    std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::begin
                              ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)
                               in_stack_fffffffffffff760);
        local_468 = (_Base_ptr)
                    std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::end
                              ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)
                               in_stack_fffffffffffff760);
        while( true ) {
          bVar2 = __gnu_cxx::
                  operator==<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                            ((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                              *)in_stack_fffffffffffff768,
                             (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                              *)in_stack_fffffffffffff760);
          if (((bVar2 ^ 0xffU) & 1) == 0) break;
          ppCVar5 = __gnu_cxx::
                    __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                    ::operator*((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                                 *)in_stack_fffffffffffff758);
          in_stack_fffffffffffff828 = (BlockManager *)*ppCVar5;
          BlockValidationState::BlockValidationState
                    ((BlockValidationState *)in_stack_fffffffffffff758);
          std::shared_ptr<const_CBlock>::shared_ptr
                    ((shared_ptr<const_CBlock> *)in_stack_fffffffffffff758,(nullptr_t)0x14a898c);
          bVar2 = Chainstate::ActivateBestChain
                            (in_stack_fffffffffffff930,in_stack_fffffffffffff928,
                             (shared_ptr<const_CBlock> *)in_stack_fffffffffffff920);
          in_stack_fffffffffffff827 = bVar2 ^ 0xff;
          std::shared_ptr<const_CBlock>::~shared_ptr
                    ((shared_ptr<const_CBlock> *)in_stack_fffffffffffff758);
          bVar2 = (in_stack_fffffffffffff827 & 1) != 0;
          if (bVar2) {
            bVar1 = true;
          }
          BlockValidationState::~BlockValidationState
                    ((BlockValidationState *)in_stack_fffffffffffff758);
          if (bVar2) break;
          __gnu_cxx::
          __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
          ::operator++((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                        *)in_stack_fffffffffffff758);
        }
        std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
                  ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffff768)
        ;
        if (bVar1) {
          local_62c = 3;
          goto LAB_014a9392;
        }
      }
      in_stack_fffffffffffff826 =
           ::node::BlockManager::IsPruneMode((BlockManager *)in_stack_fffffffffffff758);
      if ((bool)in_stack_fffffffffffff826) {
        bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffff770);
        if (bVar1) {
          bVar1 = std::__shared_ptr::operator_cast_to_bool
                            ((__shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2> *)
                             in_stack_fffffffffffff758);
          if (bVar1) {
            bVar1 = false;
            GetAll(in_stack_fffffffffffff7a8);
            local_498 = (_Base_ptr)
                        std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::begin
                                  ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)
                                   in_stack_fffffffffffff760);
            local_4a0 = (_Base_ptr)
                        std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::end
                                  ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)
                                   in_stack_fffffffffffff760);
            while( true ) {
              bVar2 = __gnu_cxx::
                      operator==<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                                ((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                                  *)in_stack_fffffffffffff768,
                                 (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                                  *)in_stack_fffffffffffff760);
              if (((bVar2 ^ 0xffU) & 1) == 0) break;
              ppCVar5 = __gnu_cxx::
                        __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                        ::operator*((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                                     *)in_stack_fffffffffffff758);
              in_stack_fffffffffffff808.fmt = (char *)*ppCVar5;
              in_stack_fffffffffffff810 = &local_1d0[0].nRewind;
              BlockValidationState::BlockValidationState
                        ((BlockValidationState *)in_stack_fffffffffffff758);
              in_stack_fffffffffffff818 = local_4b0;
              std::shared_ptr<CBlock_const>::shared_ptr<CBlock,void>
                        ((shared_ptr<const_CBlock> *)in_stack_fffffffffffff758,
                         (shared_ptr<CBlock> *)0x14a8bdc);
              in_stack_fffffffffffff825 =
                   Chainstate::ActivateBestChain
                             (in_stack_fffffffffffff930,in_stack_fffffffffffff928,
                              (shared_ptr<const_CBlock> *)in_stack_fffffffffffff920);
              bVar3 = in_stack_fffffffffffff825 ^ 0xff;
              std::shared_ptr<const_CBlock>::~shared_ptr
                        ((shared_ptr<const_CBlock> *)in_stack_fffffffffffff758);
              if ((bVar3 & 1) == 0) {
                local_62c = 0;
              }
              else {
                bVar1 = ::LogAcceptCategory((LogFlags)in_stack_fffffffffffff758,Trace);
                if (bVar1) {
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             in_stack_fffffffffffff778._M_node,(char *)in_stack_fffffffffffff770);
                  uVar9 = (undefined4)((ulong)in_stack_fffffffffffff758 >> 0x20);
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             in_stack_fffffffffffff778._M_node,(char *)in_stack_fffffffffffff770);
                  ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                            ((ValidationState<BlockValidationResult> *)
                             CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
                  in_stack_fffffffffffff768 = (char *)local_1d0;
                  in_stack_fffffffffffff760 = "failed to activate chain (%s)\n";
                  in_stack_fffffffffffff758 = (ChainstateManager *)CONCAT44(uVar9,1);
                  logging_function_01._M_len._5_1_ = in_stack_fffffffffffff825;
                  logging_function_01._M_len._0_5_ = in_stack_fffffffffffff820;
                  logging_function_01._M_len._6_1_ = in_stack_fffffffffffff826;
                  logging_function_01._M_len._7_1_ = in_stack_fffffffffffff827;
                  logging_function_01._M_str = (char *)in_stack_fffffffffffff828;
                  source_file_01._M_str = (char *)in_stack_fffffffffffff818;
                  source_file_01._M_len = (size_t)in_stack_fffffffffffff810;
                  LogPrintFormatInternal<std::__cxx11::string>
                            (logging_function_01,source_file_01,in_stack_fffffffffffff7cc,
                             (LogFlags)in_stack_fffffffffffff7c0,(Level)in_stack_fffffffffffff900,
                             (ConstevalFormatString<1U>)in_stack_fffffffffffff808.fmt,args);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff758);
                }
                bVar1 = true;
                local_62c = 10;
              }
              BlockValidationState::~BlockValidationState
                        ((BlockValidationState *)in_stack_fffffffffffff758);
              if (local_62c != 0) break;
              __gnu_cxx::
              __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
              ::operator++((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                            *)in_stack_fffffffffffff758);
            }
            std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
                      ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)
                       in_stack_fffffffffffff768);
            if (bVar1) {
              local_62c = 3;
              goto LAB_014a9392;
            }
          }
        }
      }
      NotifyHeaderTip((ChainstateManager *)
                      CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
      if (in_RCX == 0) {
        local_62c = 2;
      }
      else {
        std::deque<uint256,_std::allocator<uint256>_>::deque
                  ((deque<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff758);
        std::deque<uint256,_std::allocator<uint256>_>::push_back
                  ((deque<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff768,
                   (value_type *)in_stack_fffffffffffff760);
        while( true ) {
          bVar1 = std::deque<uint256,_std::allocator<uint256>_>::empty
                            ((deque<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff758);
          if (((bVar1 ^ 0xffU) & 1) == 0) break;
          pvVar6 = std::deque<uint256,_std::allocator<uint256>_>::front
                             ((deque<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff768)
          ;
          local_218.nRewind = *(uint64_t *)(pvVar6->super_base_blob<256U>).m_data._M_elems;
          local_218.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start =
               *(pointer *)((pvVar6->super_base_blob<256U>).m_data._M_elems + 8);
          local_218.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish =
               *(pointer *)((pvVar6->super_base_blob<256U>).m_data._M_elems + 0x10);
          local_218.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               *(pointer *)((pvVar6->super_base_blob<256U>).m_data._M_elems + 0x18);
          std::deque<uint256,_std::allocator<uint256>_>::pop_front
                    ((deque<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff758);
          pVar8 = std::
                  multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
                  ::equal_range((multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
                                 *)in_stack_fffffffffffff768,(key_type *)in_stack_fffffffffffff760);
          unique0x10001f39 = pVar8;
          while( true ) {
            bVar1 = std::operator==((_Self *)in_stack_fffffffffffff768,
                                    (_Self *)in_stack_fffffffffffff760);
            if (((bVar1 ^ 0xffU) & 1) == 0) break;
            local_578._64_8_ = local_578._72_8_;
            std::make_shared<CBlock>();
            in_stack_fffffffffffff7d8 =
                 std::__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator*((__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                           in_stack_fffffffffffff768);
            std::_Rb_tree_iterator<std::pair<const_uint256,_FlatFilePos>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_uint256,_FlatFilePos>_> *)
                       in_stack_fffffffffffff758);
            bVar1 = ::node::BlockManager::ReadBlockFromDisk
                              (in_stack_fffffffffffff828,
                               (CBlock *)
                               CONCAT17(in_stack_fffffffffffff827,
                                        CONCAT16(in_stack_fffffffffffff826,
                                                 CONCAT15(in_stack_fffffffffffff825,
                                                          in_stack_fffffffffffff820))),
                               in_stack_fffffffffffff818);
            if (bVar1) {
              bVar1 = ::LogAcceptCategory((LogFlags)in_stack_fffffffffffff758,Trace);
              in_stack_fffffffffffff7cc = CONCAT13(bVar1,(int3)in_stack_fffffffffffff7cc);
              if (bVar1) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffff778._M_node,(char *)in_stack_fffffffffffff770);
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffff778._M_node,(char *)in_stack_fffffffffffff770);
                std::__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                           in_stack_fffffffffffff758);
                uVar9 = (undefined4)((ulong)in_stack_fffffffffffff758 >> 0x20);
                CBlockHeader::GetHash((CBlockHeader *)in_stack_fffffffffffff778._M_node);
                base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff760);
                base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff760);
                in_stack_fffffffffffff778._M_node = (_Base_ptr)(local_3d0 + 0x178);
                in_stack_fffffffffffff770 = &local_218;
                in_stack_fffffffffffff768 = "LoadExternalBlockFile";
                in_stack_fffffffffffff760 = (char *)0x0;
                in_stack_fffffffffffff758 = (ChainstateManager *)CONCAT44(uVar9,1);
                logging_function_02._M_len._5_1_ = in_stack_fffffffffffff825;
                logging_function_02._M_len._0_5_ = in_stack_fffffffffffff820;
                logging_function_02._M_len._6_1_ = in_stack_fffffffffffff826;
                logging_function_02._M_len._7_1_ = in_stack_fffffffffffff827;
                logging_function_02._M_str = (char *)in_stack_fffffffffffff828;
                source_file_02._M_str = (char *)in_stack_fffffffffffff818;
                source_file_02._M_len = (size_t)in_stack_fffffffffffff810;
                LogPrintFormatInternal<char[22],std::__cxx11::string,std::__cxx11::string>
                          (logging_function_02,source_file_02,in_stack_fffffffffffff7cc,
                           (LogFlags)in_stack_fffffffffffff7c0,(Level)in_stack_fffffffffffff900,
                           (ConstevalFormatString<3U>)in_stack_fffffffffffff808.fmt,
                           (char (*) [22])args,in_RDI,in_stack_fffffffffffff920);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff758);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff758);
              }
              uVar9 = (undefined4)((ulong)in_stack_fffffffffffff760 >> 0x20);
              in_stack_fffffffffffff7c0 =
                   (BufferedFile *)
                   MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                             ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff758);
              UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                        ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                         CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
                         (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff790,
                         in_stack_fffffffffffff788,in_stack_fffffffffffff780,
                         (int)((ulong)in_stack_fffffffffffff778._M_node >> 0x20),
                         SUB81((ulong)in_stack_fffffffffffff778._M_node >> 0x18,0));
              BlockValidationState::BlockValidationState
                        ((BlockValidationState *)in_stack_fffffffffffff758);
              in_stack_fffffffffffff7a8 = (ChainstateManager *)local_578;
              std::shared_ptr<CBlock_const>::shared_ptr<CBlock,void>
                        ((shared_ptr<const_CBlock> *)in_stack_fffffffffffff758,
                         (shared_ptr<CBlock> *)0x14a91ce);
              std::_Rb_tree_iterator<std::pair<const_uint256,_FlatFilePos>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_uint256,_FlatFilePos>_> *)
                         in_stack_fffffffffffff758);
              in_stack_fffffffffffff760 = (char *)CONCAT44(uVar9,1);
              in_stack_fffffffffffff758 = (ChainstateManager *)0x0;
              bVar3 = AcceptBlock(in_stack_fffffffffffff890,in_stack_fffffffffffff888,
                                  in_stack_fffffffffffff880,
                                  (CBlockIndex **)
                                  CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
                                  SUB81((ulong)in_stack_fffffffffffff870 >> 0x38,0),
                                  in_stack_fffffffffffff868,fNewBlock,
                                  (bool)in_stack_fffffffffffff867);
              std::shared_ptr<const_CBlock>::~shared_ptr
                        ((shared_ptr<const_CBlock> *)in_stack_fffffffffffff758);
              if ((bVar3 & 1) != 0) {
                local_3d0._92_4_ = local_3d0._92_4_ + 1;
                std::__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                           in_stack_fffffffffffff758);
                CBlockHeader::GetHash((CBlockHeader *)in_stack_fffffffffffff778._M_node);
                std::deque<uint256,_std::allocator<uint256>_>::push_back
                          ((deque<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff758,
                           (value_type *)0x14a9278);
              }
              BlockValidationState::~BlockValidationState
                        ((BlockValidationState *)in_stack_fffffffffffff758);
              UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                        ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                         in_stack_fffffffffffff758);
            }
            std::_Rb_tree_iterator<std::pair<const_uint256,_FlatFilePos>_>::operator++
                      ((_Rb_tree_iterator<std::pair<const_uint256,_FlatFilePos>_> *)
                       in_stack_fffffffffffff770,(int)((ulong)in_stack_fffffffffffff768 >> 0x20));
            std::
            multimap<uint256,FlatFilePos,std::less<uint256>,std::allocator<std::pair<uint256_const,FlatFilePos>>>
            ::erase_abi_cxx11_((multimap<uint256,_FlatFilePos,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_FlatFilePos>_>_>
                                *)in_stack_fffffffffffff760,in_stack_fffffffffffff778);
            NotifyHeaderTip((ChainstateManager *)
                            CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
            std::shared_ptr<CBlock>::~shared_ptr((shared_ptr<CBlock> *)in_stack_fffffffffffff758);
          }
        }
        std::deque<uint256,_std::allocator<uint256>_>::~deque
                  ((deque<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff768);
        local_62c = 0;
      }
    }
LAB_014a9392:
    std::shared_ptr<CBlock>::~shared_ptr((shared_ptr<CBlock> *)in_stack_fffffffffffff758);
    level = (Level)in_stack_fffffffffffff900;
    in_stack_fffffffffffff79c = local_62c;
  } while ((local_62c == 0) || (local_62c == 2));
LAB_014a9534:
  bVar1 = false;
LAB_014a953f:
  BufferedFile::~BufferedFile((BufferedFile *)in_stack_fffffffffffff758);
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff778._M_node
               ,(char *)in_stack_fffffffffffff770);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff778._M_node
               ,(char *)in_stack_fffffffffffff770);
    std::chrono::_V2::steady_clock::now();
    std::chrono::operator-
              ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffff760,
               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffff758);
    Ticks<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              ((duration<long,_std::ratio<1L,_1000000000L>_>)in_stack_fffffffffffff768);
    logging_function_03._M_len._5_1_ = in_stack_fffffffffffff825;
    logging_function_03._M_len._0_5_ = in_stack_fffffffffffff820;
    logging_function_03._M_len._6_1_ = in_stack_fffffffffffff826;
    logging_function_03._M_len._7_1_ = in_stack_fffffffffffff827;
    logging_function_03._M_str = (char *)in_stack_fffffffffffff828;
    source_file_03._M_str = (char *)in_stack_fffffffffffff818;
    source_file_03._M_len = (size_t)in_stack_fffffffffffff810;
    LogPrintFormatInternal<int,long>
              (logging_function_03,source_file_03,in_stack_fffffffffffff7cc,
               (LogFlags)in_stack_fffffffffffff7c0,level,in_stack_fffffffffffff808,(int *)args,
               (long *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ChainstateManager::LoadExternalBlockFile(
    AutoFile& file_in,
    FlatFilePos* dbp,
    std::multimap<uint256, FlatFilePos>* blocks_with_unknown_parent)
{
    // Either both should be specified (-reindex), or neither (-loadblock).
    assert(!dbp == !blocks_with_unknown_parent);

    const auto start{SteadyClock::now()};
    const CChainParams& params{GetParams()};

    int nLoaded = 0;
    try {
        BufferedFile blkdat{file_in, 2 * MAX_BLOCK_SERIALIZED_SIZE, MAX_BLOCK_SERIALIZED_SIZE + 8};
        // nRewind indicates where to resume scanning in case something goes wrong,
        // such as a block fails to deserialize.
        uint64_t nRewind = blkdat.GetPos();
        while (!blkdat.eof()) {
            if (m_interrupt) return;

            blkdat.SetPos(nRewind);
            nRewind++; // start one byte further next time, in case of failure
            blkdat.SetLimit(); // remove former limit
            unsigned int nSize = 0;
            try {
                // locate a header
                MessageStartChars buf;
                blkdat.FindByte(std::byte(params.MessageStart()[0]));
                nRewind = blkdat.GetPos() + 1;
                blkdat >> buf;
                if (buf != params.MessageStart()) {
                    continue;
                }
                // read size
                blkdat >> nSize;
                if (nSize < 80 || nSize > MAX_BLOCK_SERIALIZED_SIZE)
                    continue;
            } catch (const std::exception&) {
                // no valid block header found; don't complain
                // (this happens at the end of every blk.dat file)
                break;
            }
            try {
                // read block header
                const uint64_t nBlockPos{blkdat.GetPos()};
                if (dbp)
                    dbp->nPos = nBlockPos;
                blkdat.SetLimit(nBlockPos + nSize);
                CBlockHeader header;
                blkdat >> header;
                const uint256 hash{header.GetHash()};
                // Skip the rest of this block (this may read from disk into memory); position to the marker before the
                // next block, but it's still possible to rewind to the start of the current block (without a disk read).
                nRewind = nBlockPos + nSize;
                blkdat.SkipTo(nRewind);

                std::shared_ptr<CBlock> pblock{}; // needs to remain available after the cs_main lock is released to avoid duplicate reads from disk

                {
                    LOCK(cs_main);
                    // detect out of order blocks, and store them for later
                    if (hash != params.GetConsensus().hashGenesisBlock && !m_blockman.LookupBlockIndex(header.hashPrevBlock)) {
                        LogDebug(BCLog::REINDEX, "%s: Out of order block %s, parent %s not known\n", __func__, hash.ToString(),
                                 header.hashPrevBlock.ToString());
                        if (dbp && blocks_with_unknown_parent) {
                            blocks_with_unknown_parent->emplace(header.hashPrevBlock, *dbp);
                        }
                        continue;
                    }

                    // process in case the block isn't known yet
                    const CBlockIndex* pindex = m_blockman.LookupBlockIndex(hash);
                    if (!pindex || (pindex->nStatus & BLOCK_HAVE_DATA) == 0) {
                        // This block can be processed immediately; rewind to its start, read and deserialize it.
                        blkdat.SetPos(nBlockPos);
                        pblock = std::make_shared<CBlock>();
                        blkdat >> TX_WITH_WITNESS(*pblock);
                        nRewind = blkdat.GetPos();

                        BlockValidationState state;
                        if (AcceptBlock(pblock, state, nullptr, true, dbp, nullptr, true)) {
                            nLoaded++;
                        }
                        if (state.IsError()) {
                            break;
                        }
                    } else if (hash != params.GetConsensus().hashGenesisBlock && pindex->nHeight % 1000 == 0) {
                        LogDebug(BCLog::REINDEX, "Block Import: already had block %s at height %d\n", hash.ToString(), pindex->nHeight);
                    }
                }

                // Activate the genesis block so normal node progress can continue
                if (hash == params.GetConsensus().hashGenesisBlock) {
                    bool genesis_activation_failure = false;
                    for (auto c : GetAll()) {
                        BlockValidationState state;
                        if (!c->ActivateBestChain(state, nullptr)) {
                            genesis_activation_failure = true;
                            break;
                        }
                    }
                    if (genesis_activation_failure) {
                        break;
                    }
                }

                if (m_blockman.IsPruneMode() && m_blockman.m_blockfiles_indexed && pblock) {
                    // must update the tip for pruning to work while importing with -loadblock.
                    // this is a tradeoff to conserve disk space at the expense of time
                    // spent updating the tip to be able to prune.
                    // otherwise, ActivateBestChain won't be called by the import process
                    // until after all of the block files are loaded. ActivateBestChain can be
                    // called by concurrent network message processing. but, that is not
                    // reliable for the purpose of pruning while importing.
                    bool activation_failure = false;
                    for (auto c : GetAll()) {
                        BlockValidationState state;
                        if (!c->ActivateBestChain(state, pblock)) {
                            LogDebug(BCLog::REINDEX, "failed to activate chain (%s)\n", state.ToString());
                            activation_failure = true;
                            break;
                        }
                    }
                    if (activation_failure) {
                        break;
                    }
                }

                NotifyHeaderTip();

                if (!blocks_with_unknown_parent) continue;

                // Recursively process earlier encountered successors of this block
                std::deque<uint256> queue;
                queue.push_back(hash);
                while (!queue.empty()) {
                    uint256 head = queue.front();
                    queue.pop_front();
                    auto range = blocks_with_unknown_parent->equal_range(head);
                    while (range.first != range.second) {
                        std::multimap<uint256, FlatFilePos>::iterator it = range.first;
                        std::shared_ptr<CBlock> pblockrecursive = std::make_shared<CBlock>();
                        if (m_blockman.ReadBlockFromDisk(*pblockrecursive, it->second)) {
                            LogDebug(BCLog::REINDEX, "%s: Processing out of order child %s of %s\n", __func__, pblockrecursive->GetHash().ToString(),
                                    head.ToString());
                            LOCK(cs_main);
                            BlockValidationState dummy;
                            if (AcceptBlock(pblockrecursive, dummy, nullptr, true, &it->second, nullptr, true)) {
                                nLoaded++;
                                queue.push_back(pblockrecursive->GetHash());
                            }
                        }
                        range.first++;
                        blocks_with_unknown_parent->erase(it);
                        NotifyHeaderTip();
                    }
                }
            } catch (const std::exception& e) {
                // historical bugs added extra data to the block files that does not deserialize cleanly.
                // commonly this data is between readable blocks, but it does not really matter. such data is not fatal to the import process.
                // the code that reads the block files deals with invalid data by simply ignoring it.
                // it continues to search for the next {4 byte magic message start bytes + 4 byte length + block} that does deserialize cleanly
                // and passes all of the other block validation checks dealing with POW and the merkle root, etc...
                // we merely note with this informational log message when unexpected data is encountered.
                // we could also be experiencing a storage system read error, or a read of a previous bad write. these are possible, but
                // less likely scenarios. we don't have enough information to tell a difference here.
                // the reindex process is not the place to attempt to clean and/or compact the block files. if so desired, a studious node operator
                // may use knowledge of the fact that the block files are not entirely pristine in order to prepare a set of pristine, and
                // perhaps ordered, block files for later reindexing.
                LogDebug(BCLog::REINDEX, "%s: unexpected data at file offset 0x%x - %s. continuing\n", __func__, (nRewind - 1), e.what());
            }
        }
    } catch (const std::runtime_error& e) {
        GetNotifications().fatalError(strprintf(_("System error while loading external block file: %s"), e.what()));
    }
    LogPrintf("Loaded %i blocks from external file in %dms\n", nLoaded, Ticks<std::chrono::milliseconds>(SteadyClock::now() - start));
}